

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int i4_factorial(int n)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  
  if (0xd < n) {
    std::operator<<((ostream *)&std::cerr,"I4_FACTORIAL - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  I4_FACTORIAL(N) cannot be computed as an integer\n");
    std::operator<<((ostream *)&std::cerr,"  for 13 < N.\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"  Input value N = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
    std::operator<<(poVar2,"\n");
    exit(1);
  }
  if (n < 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = 1;
    iVar3 = 1;
    do {
      iVar1 = iVar1 * iVar3;
      bVar4 = iVar3 != n;
      iVar3 = iVar3 + 1;
    } while (bVar4);
  }
  return iVar1;
}

Assistant:

BURKHARDT_EXPORT
int i4_factorial ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_FACTORIAL computes the factorial of N.
//
//  Discussion:
//
//    factorial ( N ) = product ( 1 <= I <= N ) I
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    26 June 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the argument of the factorial function.
//    If N is less than 1, the function value is returned as 1.
//    0 <= N <= 13 is required.
//
//    Output, int I4_FACTORIAL, the factorial of N.
//
{
  int i;
  int value;

  value = 1;

  if ( 13 < n ) 
  {
    value = - 1;
    std::cerr << "I4_FACTORIAL - Fatal error!\n";
    std::cerr << "  I4_FACTORIAL(N) cannot be computed as an integer\n";
    std::cerr << "  for 13 < N.\n";
    std::cerr << "  Input value N = " << n << "\n";
    exit ( 1 );
  }

  for ( i = 1; i <= n; i++ )
  {
    value = value * i;
  }

  return value;
}